

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * __thiscall
tinyformat::format<unsigned_long,Identifier>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,unsigned_long *args,
          Identifier *args_1)

{
  ostringstream local_1a0 [8];
  ostringstream oss;
  Identifier *args_local_1;
  unsigned_long *args_local;
  char *fmt_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  format<unsigned_long,Identifier>
            ((ostream *)local_1a0,(char *)this,(unsigned_long *)fmt,(Identifier *)args);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}